

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O2

OpenRangeListSyntax * __thiscall slang::parsing::Parser::parseOpenRangeList(Parser *this)

{
  bool bVar1;
  int iVar2;
  SourceLocation SVar3;
  ExpressionSyntax *pEVar4;
  undefined4 extraout_var;
  OpenRangeListSyntax *pOVar6;
  Info *extraout_RDX;
  Info *src;
  size_t extraout_RDX_00;
  Token TVar7;
  Token TVar8;
  Token local_210;
  Token local_200;
  Token openBrace;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_1e0;
  undefined1 local_1d0;
  undefined1 local_1c8 [40];
  size_t local_1a0;
  pointer pTVar5;
  
  Token::Token(&openBrace);
  Token::Token(&local_210);
  openBrace = ParserBase::expect(&this->super_ParserBase,OpenBrace);
  if ((openBrace._0_4_ >> 0x10 & 1) != 0) {
    SVar3 = Token::location(&openBrace);
    local_210 = ParserBase::missingToken(&this->super_ParserBase,CloseBrace,SVar3);
    local_1c8._24_8_ = 0;
    pTVar5 = (pointer)0x0;
    goto LAB_002ae6a4;
  }
  local_1c8._0_8_ = local_1c8 + 0x18;
  local_1c8._8_8_ = (SyntaxNode *)0x0;
  local_1c8._16_8_ = 0x10;
  TVar7 = ParserBase::peek(&this->super_ParserBase);
  local_200 = TVar7;
  bVar1 = slang::syntax::SyntaxFacts::isEndOfBracedList(TVar7.kind);
  if (bVar1) {
    SVar3 = Token::location(&local_200);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x390005,SVar3);
    local_210 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
LAB_002ae673:
    src = local_210.info;
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleOpenRangeElement(TVar7.kind);
    if (bVar1) {
      do {
        TVar7 = ParserBase::peek(&this->super_ParserBase);
        local_200 = TVar7;
        pEVar4 = parseOpenRangeElement(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0)
        ;
        local_1e0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar4;
        local_1d0 = 1;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                   (TokenOrSyntax *)&local_1e0._M_first);
        TVar8 = ParserBase::peek(&this->super_ParserBase);
        bVar1 = slang::syntax::SyntaxFacts::isEndOfBracedList(TVar8.kind);
        if (bVar1) break;
        bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
        if (!bVar1) {
          ParserBase::expect(&this->super_ParserBase,Comma);
          do {
            bVar1 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleOpenRangeElement,&slang::syntax::SyntaxFacts::isEndOfBracedList>
                              (&this->super_ParserBase,(DiagCode)0x390005,false);
            if (!bVar1) {
              local_210 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
              goto LAB_002ae673;
            }
            bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
          } while (!bVar1);
        }
        local_1e0._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_1d0 = 0;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                   (TokenOrSyntax *)&local_1e0._M_first);
        TVar8 = ParserBase::peek(&this->super_ParserBase);
        bVar1 = slang::syntax::SyntaxFacts::isEndOfBracedList(TVar8.kind);
        if (bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          break;
        }
        TVar8 = ParserBase::peek(&this->super_ParserBase);
      } while ((TVar7.info != TVar8.info || TVar7.kind != TVar8.kind) ||
              (bVar1 = ParserBase::
                       skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleOpenRangeElement,&slang::syntax::SyntaxFacts::isEndOfBracedList>
                                 (&this->super_ParserBase,(DiagCode)0x390005,true), bVar1));
      local_210 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
      goto LAB_002ae673;
    }
    ParserBase::reportMissingList
              (&this->super_ParserBase,TVar7,CloseBrace,&local_210,(DiagCode)0x390005);
    src = extraout_RDX;
  }
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
  pTVar5 = (pointer)CONCAT44(extraout_var,iVar2);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::~SmallVectorBase
            ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8);
  local_1c8._24_8_ = extraout_RDX_00;
LAB_002ae6a4:
  local_1c8._8_8_ = (SyntaxNode *)0x0;
  local_1c8._16_4_ = 3;
  local_1c8._0_8_ = &PTR_getChild_004730a0;
  local_1c8._32_8_ = pTVar5;
  local_1a0 = local_1c8._24_8_;
  pOVar6 = slang::syntax::SyntaxFactory::openRangeList
                     (&this->factory,openBrace,
                      (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)local_1c8,local_210);
  return pOVar6;
}

Assistant:

OpenRangeListSyntax& Parser::parseOpenRangeList() {
    Token openBrace;
    Token closeBrace;
    span<TokenOrSyntax> list;

    parseList<isPossibleOpenRangeElement, isEndOfBracedList>(
        TokenKind::OpenBrace, TokenKind::CloseBrace, TokenKind::Comma, openBrace, list, closeBrace,
        RequireItems::True, diag::ExpectedOpenRangeElement,
        [this] { return &parseOpenRangeElement(); });

    return factory.openRangeList(openBrace, list, closeBrace);
}